

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryDecoder.cc
# Opt level: O0

void __thiscall avro::BinaryDecoder::decodeString(BinaryDecoder *this,string *value)

{
  int iVar1;
  uint8_t *b;
  StreamReader *in_RSI;
  long *in_RDI;
  size_t len;
  
  iVar1 = (**(code **)(*in_RDI + 0x28))();
  b = (uint8_t *)(long)iVar1;
  std::__cxx11::string::resize((ulong)in_RSI);
  if (b != (uint8_t *)0x0) {
    std::__cxx11::string::operator[]((ulong)in_RSI);
    StreamReader::readBytes(in_RSI,b,(size_t)in_RDI);
  }
  return;
}

Assistant:

void BinaryDecoder::decodeString(std::string& value)
{
    size_t len = decodeInt();
    value.resize(len);
    if (len > 0) {
        in_.readBytes(reinterpret_cast<uint8_t*>(&value[0]), len);
    }
}